

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_NCName_ID_IDREF_ENTITY(DataType dt)

{
  char cVar1;
  XMLCh *pXVar2;
  XSValue *pXVar3;
  long lVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  Status myStatus;
  char iv_3 [5];
  char v_3 [5];
  char iv_1 [9];
  char v_1 [8];
  char v_2 [12];
  char iv_2 [13];
  Status local_8c;
  StrX local_88;
  char local_78 [8];
  char local_70 [8];
  char local_68 [16];
  char local_58 [8];
  undefined8 local_50;
  undefined4 local_48;
  char local_40 [16];
  
  builtin_strncpy(local_58,"Four-_.",8);
  local_50 = 0x68636f7265655a5f;
  local_48 = 0x747265;
  builtin_strncpy(local_70,"L007",5);
  builtin_strncpy(local_68,":Four-_.",9);
  builtin_strncpy(local_40 + 8,"ert:",5);
  builtin_strncpy(local_40,"_Zeeroch",8);
  builtin_strncpy(local_78,"0:07",5);
  local_8c = st_Init;
  local_88.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_88.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&local_8c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar1 == '\0') {
    pXVar2 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar2);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1784,local_58,local_88.fLocalForm,1);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  local_8c = st_Init;
  local_88.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_88.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&local_8c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar1 == '\0') {
    pXVar2 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar2);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1785,&local_50,local_88.fLocalForm,1);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  local_8c = st_Init;
  local_88.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_88.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&local_8c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar1 == '\0') {
    pXVar2 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar2);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1786,local_70,local_88.fLocalForm,1);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  local_8c = st_Init;
  local_88.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_88.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&local_8c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar1 != '\0') {
    pXVar2 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar2);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1789,local_68,local_88.fLocalForm,0);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  local_8c = st_Init;
  local_88.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_88.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&local_8c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar1 != '\0') {
    pXVar2 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar2);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x178a,local_40,local_88.fLocalForm,0);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  local_8c = st_Init;
  local_88.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_88.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&local_8c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar1 != '\0') {
    pXVar2 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar2);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x178b,local_78,local_88.fLocalForm,0);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  iVar9 = 1;
  do {
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar8 = SUB41(iVar9,0);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar3 == (XSValue *)0x0) {
      if (local_8c != st_NoActVal) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a5,local_58,local_88.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      pvVar5 = (void *)0x17a5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a5,local_58);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar5);
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar3 == (XSValue *)0x0) {
      if (local_8c != st_NoActVal) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a6,&local_50,local_88.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      pvVar5 = (void *)0x17a6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a6,&local_50);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar5);
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar3 == (XSValue *)0x0) {
      if (local_8c != st_NoActVal) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a7,local_70,local_88.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      pvVar5 = (void *)0x17a7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a7,local_70);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar5);
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar3 == (XSValue *)0x0) {
      if (iVar9 * 3 + st_NoActVal != local_8c) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_NoActVal";
        if (bVar8 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17ab,local_68,local_88.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      pvVar5 = (void *)0x17ab;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ab,local_68);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar5);
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar3 == (XSValue *)0x0) {
      if (iVar9 * 3 + st_NoActVal != local_8c) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_NoActVal";
        if (bVar8 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17ad,local_40,local_88.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      pvVar5 = (void *)0x17ad;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ad,local_40);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar5);
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar3 == (XSValue *)0x0) {
      if (iVar9 * 3 + st_NoActVal != local_8c) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_NoActVal";
        if (bVar8 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17af,local_78,local_88.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      pvVar5 = (void *)0x17af;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17af,local_78);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar5);
    }
    iVar9 = 0;
  } while (bVar8 != false);
  iVar9 = 1;
  do {
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar8 = SUB41(iVar9,0);
    lVar4 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (lVar4 == 0) {
      if (local_8c != st_NoCanRep) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17cc,local_58,local_88.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_88);
        goto LAB_001368e5;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17cc,local_58);
      StrX::~StrX(&local_88);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar4);
LAB_001368e5:
      errSeen = 1;
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar4 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (lVar4 == 0) {
      if (local_8c != st_NoCanRep) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17cd,&local_50,local_88.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_88);
        goto LAB_001369e6;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17cd,&local_50);
      StrX::~StrX(&local_88);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar4);
LAB_001369e6:
      errSeen = 1;
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar4 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (lVar4 == 0) {
      if (local_8c != st_NoCanRep) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17ce,local_70,local_88.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_88);
        goto LAB_00136ae7;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ce,local_70);
      StrX::~StrX(&local_88);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar4);
LAB_00136ae7:
      errSeen = 1;
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar4 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (lVar4 == 0) {
      if (iVar9 * 4 + st_NoCanRep != local_8c) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_NoCanRep";
        if (bVar8 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17d2,local_68,local_88.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_88);
        goto LAB_00136bfe;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17d2,local_68);
      StrX::~StrX(&local_88);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar4);
LAB_00136bfe:
      errSeen = 1;
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar4 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (lVar4 == 0) {
      if (iVar9 * 4 + st_NoCanRep != local_8c) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_NoCanRep";
        if (bVar8 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17d4,local_40,local_88.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_88);
        goto LAB_00136d15;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17d4,local_40);
      StrX::~StrX(&local_88);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar4);
LAB_00136d15:
      errSeen = 1;
    }
    local_8c = st_Init;
    local_88.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar4 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_88.fUnicodeForm,dt,&local_8c,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (lVar4 == 0) {
      if (iVar9 * 4 + st_NoCanRep != local_8c) {
        pXVar2 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar2);
        pcVar6 = "st_NoCanRep";
        if (bVar8 != false) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_8c < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_8c];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x17d6,local_78,local_88.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_88);
        goto LAB_00136e2c;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar2);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17d6,local_78);
      StrX::~StrX(&local_88);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar4);
LAB_00136e2c:
      errSeen = 1;
    }
    iVar9 = 0;
    if (bVar8 == false) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_NCName_ID_IDREF_ENTITY(XSValue::DataType dt)
{
    bool  toValidate = true;

    const char v_1[]="Four-_.";
    const char v_2[]="_Zeerochert";
    const char v_3[]="L007";

    const char iv_1[]=":Four-_.";
    const char iv_2[]="_Zeerochert:";
    const char iv_3[]="0:07";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}